

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall
SchnorrUtil_ComputeSigPointBatch_Test::TestBody(SchnorrUtil_ComputeSigPointBatch_Test *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  char *message;
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::core::SchnorrPubkey> __l_00;
  allocator_type local_13a;
  allocator_type local_139;
  string local_138;
  AssertionResult gtest_ar;
  Pubkey expected_sig_point;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> sig_points;
  undefined1 local_c0 [48];
  SchnorrPubkey local_90;
  Pubkey actual_sig_point;
  vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_> nonces;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> data;
  
  std::__cxx11::string::string
            ((string *)&local_138,"e48441762fb75010b2aa31a512b62b4148aa3fb08eb0765d76b252559064a614"
             ,(allocator *)&nonces);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_c0,&local_138);
  std::__cxx11::string::string
            ((string *)&sig_points,
             "80a1c2125d13d6b2d639f2da507772040719d36c6228ec141befd1aecb901b17",
             (allocator *)&actual_sig_point);
  cfd::core::ByteData256::ByteData256((ByteData256 *)(local_c0 + 0x18),(string *)&sig_points);
  std::__cxx11::string::string
            ((string *)&expected_sig_point,
             "375a7aec74bba181ffca89ef03bd8a10d7ddae7813190d4616652d9e91bcff20",
             (allocator *)&gtest_ar);
  cfd::core::ByteData256::ByteData256(&local_90.data_,(string *)&expected_sig_point);
  __l._M_len = 3;
  __l._M_array = (iterator)local_c0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&data,__l,&local_13a);
  lVar1 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&expected_sig_point);
  std::__cxx11::string::~string((string *)&sig_points);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string
            ((string *)&local_138,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,(allocator *)&actual_sig_point);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_c0,&local_138);
  std::__cxx11::string::string
            ((string *)&sig_points,
             "f14d7e54ff58c5d019ce9986be4a0e8b7d643bd08ef2cdf1099e1a457865b547",
             (allocator *)&gtest_ar);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)(local_c0 + 0x18),(string *)&sig_points);
  std::__cxx11::string::string
            ((string *)&expected_sig_point,
             "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
             (allocator *)&local_13a);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_90,(string *)&expected_sig_point);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_c0;
  std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::vector
            (&nonces,__l_00,&local_139);
  lVar1 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&expected_sig_point);
  std::__cxx11::string::~string((string *)&sig_points);
  std::__cxx11::string::~string((string *)&local_138);
  sig_points.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig_points.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig_points.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)data.
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)data.
                            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar2 = uVar2 + 1) {
    cfd::core::SchnorrUtil::ComputeSigPoint
              ((Pubkey *)local_c0,
               (ByteData256 *)
               ((long)&((data.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1),
               (SchnorrPubkey *)
               ((long)&((nonces.
                         super__Vector_base<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1),&::pubkey);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
    emplace_back<cfd::core::Pubkey>(&sig_points,(Pubkey *)local_c0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
    lVar1 = lVar1 + 0x18;
  }
  cfd::core::Pubkey::CombinePubkey(&expected_sig_point,&sig_points);
  cfd::core::SchnorrUtil::ComputeSigPointBatch(&actual_sig_point,&data,&nonces,&::pubkey);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_c0,&expected_sig_point);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_138,&actual_sig_point);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expected_sig_point.GetHex()","actual_sig_point.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             &local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)local_c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x118,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual_sig_point);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&expected_sig_point);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&sig_points);
  std::vector<cfd::core::SchnorrPubkey,_std::allocator<cfd::core::SchnorrPubkey>_>::~vector(&nonces)
  ;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&data);
  return;
}

Assistant:

TEST(SchnorrUtil, ComputeSigPointBatch) {
  std::vector<ByteData256> data = {
      ByteData256(
          "e48441762fb75010b2aa31a512b62b4148aa3fb08eb0765d76b252559064a614"),
      ByteData256(
          "80a1c2125d13d6b2d639f2da507772040719d36c6228ec141befd1aecb901b17"),
      ByteData256(
          "375a7aec74bba181ffca89ef03bd8a10d7ddae7813190d4616652d9e91bcff20"),
  };

  std::vector<SchnorrPubkey> nonces = {
      SchnorrPubkey(
          "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
      SchnorrPubkey(
          "f14d7e54ff58c5d019ce9986be4a0e8b7d643bd08ef2cdf1099e1a457865b547"),
      SchnorrPubkey(
          "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")};

  std::vector<Pubkey> sig_points;
  for (size_t i = 0; i < data.size(); i++) {
    sig_points.push_back(
        SchnorrUtil::ComputeSigPoint(data[i], nonces[i], pubkey));
  }
  auto expected_sig_point = Pubkey::CombinePubkey(sig_points);

  auto actual_sig_point =
      SchnorrUtil::ComputeSigPointBatch(data, nonces, pubkey);

  ASSERT_EQ(expected_sig_point.GetHex(), actual_sig_point.GetHex());
}